

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::impl::anon_unknown_0::xpath_ast_node::is_posinv_step(xpath_ast_node *this)

{
  xpath_ast_node *n;
  xpath_ast_node *this_local;
  
  n = this->_right;
  while( true ) {
    if (n == (xpath_ast_node *)0x0) {
      return true;
    }
    if (n->_test != '\x01') break;
    n = n->_next;
  }
  return false;
}

Assistant:

bool is_posinv_step() const
		{
			assert(_type == ast_step);

			for (xpath_ast_node* n = _right; n; n = n->_next)
			{
				assert(n->_type == ast_predicate);

				if (n->_test != predicate_posinv)
					return false;
			}

			return true;
		}